

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  xml_node<char> *node;
  size_t sVar1;
  undefined8 *puVar2;
  char *pcVar3;
  char *pcVar4;
  
  node = memory_pool<char>::allocate_node
                   (&this->super_memory_pool<char>,node_element,(char *)0x0,(char *)0x0,0,0);
  pcVar3 = *text;
  skip<rapidxml::xml_document<char>::node_name_pred,0>(text);
  sVar1 = (long)*text - (long)pcVar3;
  if (sVar1 == 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
    pcVar3 = *text;
    *puVar2 = &PTR__exception_00176490;
    pcVar4 = "expected element name";
  }
  else {
    (node->super_xml_base<char>).m_name = pcVar3;
    (node->super_xml_base<char>).m_name_size = sVar1;
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    parse_node_attributes<0>(this,text,node);
    pcVar3 = *text;
    if (*pcVar3 == '/') {
      *text = pcVar3 + 1;
      if (pcVar3[1] == '>') {
        *text = pcVar3 + 2;
        goto LAB_00146bf5;
      }
    }
    else if (*pcVar3 == '>') {
      *text = pcVar3 + 1;
      parse_node_contents<0>(this,text,node);
LAB_00146bf5:
      pcVar3 = (node->super_xml_base<char>).m_name;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = &xml_base<char>::nullstr()::zero;
        sVar1 = 0;
      }
      else {
        sVar1 = (node->super_xml_base<char>).m_name_size;
      }
      pcVar3[sVar1] = '\0';
      return node;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
    pcVar3 = *text;
    *puVar2 = &PTR__exception_00176490;
    pcVar4 = "expected >";
  }
  puVar2[1] = pcVar4;
  puVar2[2] = pcVar3;
  __cxa_throw(puVar2,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *name = text;
            skip<node_name_pred, Flags>(text);
            if (text == name)
                RAPIDXML_PARSE_ERROR("expected element name", text);
            element->name(name, text - name);
            
            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                ++text;
                parse_node_contents<Flags>(text, element);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators))
                element->name()[element->name_size()] = Ch('\0');

            // Return parsed element
            return element;
        }